

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureSamplerTest::renderReferences
          (TextureSamplerTest *this,Surface *textureRef,Surface *samplerRef,int x,int y)

{
  SamplingState *pSVar1;
  RenderContext *pRVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  PixelBufferAccess local_c0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  GLfloat local_80;
  PixelBufferAccess local_78;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  GLfloat local_38;
  GLuint local_34;
  Functions *pFStack_30;
  GLuint texture;
  Functions *gl;
  int y_local;
  int x_local;
  Surface *samplerRef_local;
  Surface *textureRef_local;
  TextureSamplerTest *this_local;
  
  gl._0_4_ = y;
  gl._4_4_ = x;
  _y_local = samplerRef;
  samplerRef_local = textureRef;
  textureRef_local = (Surface *)this;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  pFStack_30 = (Functions *)CONCAT44(extraout_var,iVar4);
  local_34 = createTexture(pFStack_30,this->m_target);
  (*pFStack_30->viewport)(gl._4_4_,(int)gl,0x80,0x80);
  GVar5 = (*pFStack_30->getError)();
  glu::checkError(GVar5,"glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1ed);
  (*pFStack_30->bindTexture)(this->m_target,local_34);
  GVar5 = (*pFStack_30->getError)();
  glu::checkError(GVar5,"glBindTexture(m_target, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1f0);
  pSVar1 = &this->m_textureState;
  local_50._0_4_ = pSVar1->minFilter;
  local_50._4_4_ = pSVar1->magFilter;
  local_48._0_4_ = (this->m_textureState).wrapT;
  local_48._4_4_ = (this->m_textureState).wrapS;
  local_40._0_4_ = (this->m_textureState).wrapR;
  local_40._4_4_ = (this->m_textureState).minLod;
  local_38 = (this->m_textureState).maxLod;
  setTextureState(pFStack_30,this->m_target,*pSVar1);
  render(this);
  iVar3 = gl._4_4_;
  iVar4 = (int)gl;
  pRVar2 = this->m_renderCtx;
  tcu::Surface::getAccess(&local_78,samplerRef_local);
  glu::readPixels(pRVar2,iVar3,iVar4,&local_78);
  pSVar1 = &this->m_samplerState;
  local_98._0_4_ = pSVar1->minFilter;
  local_98._4_4_ = pSVar1->magFilter;
  local_90._0_4_ = (this->m_samplerState).wrapT;
  local_90._4_4_ = (this->m_samplerState).wrapS;
  local_88._0_4_ = (this->m_samplerState).wrapR;
  local_88._4_4_ = (this->m_samplerState).minLod;
  local_80 = (this->m_samplerState).maxLod;
  setTextureState(pFStack_30,this->m_target,*pSVar1);
  render(this);
  iVar3 = gl._4_4_;
  iVar4 = (int)gl;
  pRVar2 = this->m_renderCtx;
  tcu::Surface::getAccess(&local_c0,_y_local);
  glu::readPixels(pRVar2,iVar3,iVar4,&local_c0);
  (*pFStack_30->deleteTextures)(1,&local_34);
  GVar5 = (*pFStack_30->getError)();
  glu::checkError(GVar5,"glDeleteTextures(1, &texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1fb);
  return;
}

Assistant:

void TextureSamplerTest::renderReferences (tcu::Surface& textureRef, tcu::Surface& samplerRef, int x, int y)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	GLuint					texture	= createTexture(gl, m_target);

	gl.viewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)");

	gl.bindTexture(m_target, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture)");

	setTextureState(gl, m_target, m_textureState);
	render();
	glu::readPixels(m_renderCtx, x, y, textureRef.getAccess());

	setTextureState(gl, m_target, m_samplerState);
	render();
	glu::readPixels(m_renderCtx, x, y, samplerRef.getAccess());

	gl.deleteTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures(1, &texture)");
}